

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

double __thiscall
imrt::EvaluationFunction::get_impact_beamlet(EvaluationFunction *this,int angle,int b)

{
  int iVar1;
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  *__x;
  Matrix *pMVar2;
  _Base_ptr p_Var3;
  long lVar4;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  double local_70;
  key_type local_68;
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  local_60;
  
  local_68.second = b;
  local_68.first = angle;
  __x = &std::__detail::
         _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&this->beamlet2voxel_list,&local_68)->_M_t;
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::_Rb_tree(&local_60,__x);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_60._M_impl.super__Rb_tree_header) {
    local_70 = 0.0;
  }
  else {
    local_70 = 0.0;
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      iVar1 = *(int *)&p_Var3[1]._M_parent;
      lVar4 = (long)*(int *)((long)&p_Var3[1]._M_parent + 4);
      pMVar2 = Volume::getDepositionMatrix
                         ((this->volumes->
                          super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
                          super__Vector_impl_data._M_start + iVar1,angle);
      local_70 = local_70 +
                 *(double *)
                  (*(long *)&(this->D).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar1].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data + lVar4 * 8) * pMVar2->p[lVar4][b];
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree(&local_60);
  return local_70;
}

Assistant:

double EvaluationFunction::get_impact_beamlet(int angle, int b){
			double ev=0;
			multimap<double, pair<int,int> > voxels = beamlet2voxel_list[make_pair(angle,b)];
			for(auto voxel:voxels){
				int o=voxel.second.first;
				int k=voxel.second.second;
				const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
				ev += D[o][k] * Dep(k,b);
			}
			return ev;
}